

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpumon.cpp
# Opt level: O2

void __thiscall cpumon::cpumon(cpumon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  long lVar3;
  pointer ppVar4;
  initializer_list<prmon::parameter> __l;
  allocator_type local_24e;
  allocator local_24d;
  allocator local_24c;
  allocator local_24b;
  allocator local_24a;
  allocator local_249;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
  *local_248;
  parameter_list *local_240;
  cpumon *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [192];
  parameter local_90;
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__cpumon_001db5d8;
  std::__cxx11::string::string((string *)&local_170,"utime",(allocator *)&local_230);
  std::__cxx11::string::string((string *)&local_190,"s",&local_249);
  std::__cxx11::string::string((string *)&local_1b0,"",&local_24a);
  prmon::parameter::parameter((parameter *)local_150,&local_170,&local_190,&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"stime",&local_24b);
  std::__cxx11::string::string((string *)&local_1f0,"s",&local_24c);
  std::__cxx11::string::string((string *)&local_210,"",&local_24d);
  prmon::parameter::parameter((parameter *)(local_150 + 0x60),&local_1d0,&local_1f0,&local_210);
  __l._M_len = 2;
  __l._M_array = (iterator)local_150;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,&local_24e);
  lVar3 = 0x60;
  do {
    prmon::parameter::~parameter((parameter *)(local_150 + lVar3));
    lVar3 = lVar3 + -0x60;
  } while (lVar3 != -0x60);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  local_248 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
               *)&this->cpu_stats;
  p_Var1 = &(this->cpu_stats)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->cpu_stats)._M_t._M_impl = 0;
  *(undefined8 *)&(this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cpu_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240 = &this->params;
  local_238 = this;
  std::__cxx11::string::string((string *)local_150,"cpumon",(allocator *)&local_230);
  MessageBase::log_init(&this->super_MessageBase,(string *)local_150,&global_logging_level);
  std::__cxx11::string::~string((string *)local_150);
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->params).
                super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>._M_impl.
                super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    std::__cxx11::string::string((string *)&local_230,(string *)ppVar4);
    prmon::parameter::parameter(&local_90,ppVar4);
    prmon::monitored_value::monitored_value((monitored_value *)local_150,&local_90,true,0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
    ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
              (local_248,&local_230,(monitored_value *)local_150);
    prmon::parameter::~parameter((parameter *)local_150);
    prmon::parameter::~parameter(&local_90);
    std::__cxx11::string::~string((string *)&local_230);
  }
  return;
}

Assistant:

cpumon::cpumon() : cpu_stats{} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    cpu_stats.emplace(param.get_name(), prmon::monitored_value(param, true));
  }
}